

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnStructType
          (BinaryReaderIR *this,Index index,Index field_count,TypeMut *fields)

{
  byte bVar1;
  Module *this_00;
  unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> uVar2;
  pointer pSVar3;
  ulong uVar4;
  reference pvVar5;
  pointer pTVar6;
  unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> local_68;
  uint local_5c;
  Index i;
  unique_ptr<wabt::StructType,_std::default_delete<wabt::StructType>_> struct_type;
  unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> local_30;
  unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> field;
  TypeMut *fields_local;
  Index field_count_local;
  Index index_local;
  BinaryReaderIR *this_local;
  
  field._M_t.
  super___uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>._M_t.
  super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
  super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>,_true,_true>
        )(__uniq_ptr_data<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>,_true,_true>
          )fields;
  GetLocation((Location *)&struct_type,this);
  MakeUnique<wabt::TypeModuleField,wabt::Location>((wabt *)&local_30,(Location *)&struct_type);
  MakeUnique<wabt::StructType>();
  pSVar3 = std::unique_ptr<wabt::StructType,_std::default_delete<wabt::StructType>_>::operator->
                     ((unique_ptr<wabt::StructType,_std::default_delete<wabt::StructType>_> *)
                      &stack0xffffffffffffffa8);
  std::vector<wabt::Field,_std::allocator<wabt::Field>_>::resize(&pSVar3->fields,(ulong)field_count)
  ;
  for (local_5c = 0;
      uVar2._M_t.
      super___uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>._M_t
      .super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
      super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
           field._M_t.
           super___uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
           .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl,
      local_5c < field_count; local_5c = local_5c + 1) {
    uVar4 = (ulong)local_5c;
    pSVar3 = std::unique_ptr<wabt::StructType,_std::default_delete<wabt::StructType>_>::operator->
                       ((unique_ptr<wabt::StructType,_std::default_delete<wabt::StructType>_> *)
                        &stack0xffffffffffffffa8);
    pvVar5 = std::vector<wabt::Field,_std::allocator<wabt::Field>_>::operator[]
                       (&pSVar3->fields,(ulong)local_5c);
    (pvVar5->type).enum_ =
         *(Enum *)((long)uVar2._M_t.
                         super___uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                         .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl +
                  uVar4 * 8);
    bVar1 = *(byte *)((long)field._M_t.
                            super___uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                            .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 4
                     + (ulong)local_5c * 8);
    pSVar3 = std::unique_ptr<wabt::StructType,_std::default_delete<wabt::StructType>_>::operator->
                       ((unique_ptr<wabt::StructType,_std::default_delete<wabt::StructType>_> *)
                        &stack0xffffffffffffffa8);
    pvVar5 = std::vector<wabt::Field,_std::allocator<wabt::Field>_>::operator[]
                       (&pSVar3->fields,(ulong)local_5c);
    pvVar5->mutable_ = (bool)(bVar1 & 1);
  }
  pTVar6 = std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::
           operator->(&local_30);
  std::unique_ptr<wabt::TypeEntry,std::default_delete<wabt::TypeEntry>>::operator=
            ((unique_ptr<wabt::TypeEntry,std::default_delete<wabt::TypeEntry>> *)&pTVar6->type,
             (unique_ptr<wabt::StructType,_std::default_delete<wabt::StructType>_> *)
             &stack0xffffffffffffffa8);
  this_00 = this->module_;
  std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::unique_ptr
            (&local_68,&local_30);
  Module::AppendField(this_00,&local_68);
  std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::~unique_ptr
            (&local_68);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  std::unique_ptr<wabt::StructType,_std::default_delete<wabt::StructType>_>::~unique_ptr
            ((unique_ptr<wabt::StructType,_std::default_delete<wabt::StructType>_> *)
             &stack0xffffffffffffffa8);
  std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::~unique_ptr
            (&local_30);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnStructType(Index index,
                                    Index field_count,
                                    TypeMut* fields) {
  auto field = MakeUnique<TypeModuleField>(GetLocation());
  auto struct_type = MakeUnique<StructType>();
  struct_type->fields.resize(field_count);
  for (Index i = 0; i < field_count; ++i) {
    struct_type->fields[i].type = fields[i].type;
    struct_type->fields[i].mutable_ = fields[i].mutable_;
  }
  field->type = std::move(struct_type);
  module_->AppendField(std::move(field));
  return Result::Ok;
}